

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.c
# Opt level: O0

size_t FSE_decompress_usingDTable
                 (void *dst,size_t originalSize,void *cSrc,size_t cSrcSize,FSE_DTable *dt)

{
  byte bVar1;
  uint uVar2;
  BIT_DStream_status BVar3;
  byte *pbVar4;
  byte *pbVar5;
  long in_RSI;
  byte *in_RDI;
  long in_R8;
  U32 fastMode;
  FSE_DTableHeader *DTableH;
  void *ptr;
  size_t e_1;
  FSE_DState_t state2_1;
  FSE_DState_t state1_1;
  BIT_DStream_t bitD_1;
  BYTE *olimit_1;
  BYTE *omax_1;
  BYTE *op_1;
  BYTE *ostart_1;
  size_t e;
  FSE_DState_t state2;
  FSE_DState_t state1;
  BIT_DStream_t bitD;
  BYTE *olimit;
  BYTE *omax;
  BYTE *op;
  BYTE *ostart;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  uint in_stack_fffffffffffffe38;
  uint in_stack_fffffffffffffe3c;
  uint in_stack_fffffffffffffe40;
  uint in_stack_fffffffffffffe44;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  size_t local_158;
  byte *local_f0;
  size_t local_b0;
  byte *local_48;
  size_t local_8;
  
  if (*(short *)(in_R8 + 2) == 0) {
    local_b0 = BIT_initDStream((BIT_DStream_t *)
                               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                               (void *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40)
                               ,CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    uVar2 = ERR_isError(local_b0);
    if (uVar2 == 0) {
      FSE_initDState((FSE_DState_t *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                     (BIT_DStream_t *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                     (FSE_DTable *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      FSE_initDState((FSE_DState_t *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                     (BIT_DStream_t *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                     (FSE_DTable *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      for (local_f0 = in_RDI;
          BVar3 = BIT_reloadDStream((BIT_DStream_t *)
                                    CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)),
          pbVar5 = local_f0, BVar3 == BIT_DStream_unfinished && local_f0 < in_RDI + in_RSI + -3;
          local_f0 = local_f0 + 4) {
        bVar1 = FSE_decodeSymbol((FSE_DState_t *)
                                 CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                 (BIT_DStream_t *)
                                 CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        *local_f0 = bVar1;
        bVar1 = FSE_decodeSymbol((FSE_DState_t *)
                                 CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                 (BIT_DStream_t *)
                                 CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        in_stack_fffffffffffffe44 = (uint)bVar1;
        local_f0[1] = bVar1;
        bVar1 = FSE_decodeSymbol((FSE_DState_t *)(ulong)CONCAT14(bVar1,in_stack_fffffffffffffe40),
                                 (BIT_DStream_t *)
                                 CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        in_stack_fffffffffffffe40 = (uint)bVar1;
        local_f0[2] = bVar1;
        bVar1 = FSE_decodeSymbol((FSE_DState_t *)
                                 CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                 (BIT_DStream_t *)
                                 CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        in_stack_fffffffffffffe3c = (uint)bVar1;
        local_f0[3] = bVar1;
      }
      do {
        local_f0 = pbVar5;
        if (in_RDI + in_RSI + -2 < local_f0) {
          local_b0 = 0xffffffffffffffba;
          goto LAB_0024cf37;
        }
        bVar1 = FSE_decodeSymbol((FSE_DState_t *)
                                 CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                 (BIT_DStream_t *)
                                 CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        in_stack_fffffffffffffe38 = (uint)bVar1;
        pbVar4 = local_f0 + 1;
        *local_f0 = bVar1;
        BVar3 = BIT_reloadDStream((BIT_DStream_t *)
                                  CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        if (BVar3 == BIT_DStream_overflow) {
          bVar1 = FSE_decodeSymbol((FSE_DState_t *)
                                   CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                   (BIT_DStream_t *)
                                   CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
          local_f0 = local_f0 + 2;
          *pbVar4 = bVar1;
          goto LAB_0024cf1c;
        }
        if (in_RDI + in_RSI + -2 < pbVar4) {
          local_b0 = 0xffffffffffffffba;
          goto LAB_0024cf37;
        }
        bVar1 = FSE_decodeSymbol((FSE_DState_t *)
                                 CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                 (BIT_DStream_t *)
                                 CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        pbVar5 = local_f0 + 2;
        *pbVar4 = bVar1;
        BVar3 = BIT_reloadDStream((BIT_DStream_t *)
                                  CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      } while (BVar3 != BIT_DStream_overflow);
      bVar1 = FSE_decodeSymbol((FSE_DState_t *)
                               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                               (BIT_DStream_t *)
                               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      local_f0 = local_f0 + 3;
      *pbVar5 = bVar1;
LAB_0024cf1c:
      local_b0 = (long)local_f0 - (long)in_RDI;
    }
LAB_0024cf37:
    local_158 = local_b0;
  }
  else {
    local_8 = BIT_initDStream((BIT_DStream_t *)
                              CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                              (void *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                              CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    uVar2 = ERR_isError(local_8);
    if (uVar2 == 0) {
      FSE_initDState((FSE_DState_t *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                     (BIT_DStream_t *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                     (FSE_DTable *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      FSE_initDState((FSE_DState_t *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                     (BIT_DStream_t *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                     (FSE_DTable *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      for (local_48 = in_RDI;
          BVar3 = BIT_reloadDStream((BIT_DStream_t *)
                                    CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)),
          pbVar5 = local_48, BVar3 == BIT_DStream_unfinished && local_48 < in_RDI + in_RSI + -3;
          local_48 = local_48 + 4) {
        bVar1 = FSE_decodeSymbolFast
                          ((FSE_DState_t *)
                           CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                           (BIT_DStream_t *)
                           CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        *local_48 = bVar1;
        bVar1 = FSE_decodeSymbolFast
                          ((FSE_DState_t *)
                           CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                           (BIT_DStream_t *)
                           CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        local_48[1] = bVar1;
        bVar1 = FSE_decodeSymbolFast
                          ((FSE_DState_t *)
                           CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                           (BIT_DStream_t *)
                           CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        local_48[2] = bVar1;
        bVar1 = FSE_decodeSymbolFast
                          ((FSE_DState_t *)
                           CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                           (BIT_DStream_t *)
                           CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        local_48[3] = bVar1;
      }
      do {
        local_48 = pbVar5;
        if (in_RDI + in_RSI + -2 < local_48) {
          local_8 = 0xffffffffffffffba;
          goto LAB_0024ca2f;
        }
        bVar1 = FSE_decodeSymbolFast
                          ((FSE_DState_t *)
                           CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                           (BIT_DStream_t *)
                           CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        pbVar4 = local_48 + 1;
        *local_48 = bVar1;
        BVar3 = BIT_reloadDStream((BIT_DStream_t *)
                                  CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        if (BVar3 == BIT_DStream_overflow) {
          bVar1 = FSE_decodeSymbolFast
                            ((FSE_DState_t *)
                             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                             (BIT_DStream_t *)
                             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
          local_48 = local_48 + 2;
          *pbVar4 = bVar1;
          goto LAB_0024ca14;
        }
        if (in_RDI + in_RSI + -2 < pbVar4) {
          local_8 = 0xffffffffffffffba;
          goto LAB_0024ca2f;
        }
        bVar1 = FSE_decodeSymbolFast
                          ((FSE_DState_t *)
                           CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                           (BIT_DStream_t *)
                           CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        pbVar5 = local_48 + 2;
        *pbVar4 = bVar1;
        BVar3 = BIT_reloadDStream((BIT_DStream_t *)
                                  CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      } while (BVar3 != BIT_DStream_overflow);
      bVar1 = FSE_decodeSymbolFast
                        ((FSE_DState_t *)
                         CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                         (BIT_DStream_t *)
                         CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      local_48 = local_48 + 3;
      *pbVar5 = bVar1;
LAB_0024ca14:
      local_8 = (long)local_48 - (long)in_RDI;
    }
LAB_0024ca2f:
    local_158 = local_8;
  }
  return local_158;
}

Assistant:

size_t FSE_decompress_usingDTable(void* dst, size_t originalSize,
                            const void* cSrc, size_t cSrcSize,
                            const FSE_DTable* dt)
{
    const void* ptr = dt;
    const FSE_DTableHeader* DTableH = (const FSE_DTableHeader*)ptr;
    const U32 fastMode = DTableH->fastMode;

    /* select fast mode (static) */
    if (fastMode) return FSE_decompress_usingDTable_generic(dst, originalSize, cSrc, cSrcSize, dt, 1);
    return FSE_decompress_usingDTable_generic(dst, originalSize, cSrc, cSrcSize, dt, 0);
}